

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_ecdsa_anti_exfil_host_commit
              (secp256k1_context *ctx,uchar *rand_commitment32,uchar *rand32)

{
  secp256k1_sha256 sha;
  secp256k1_sha256 local_78;
  
  if (rand_commitment32 == (uchar *)0x0) {
    secp256k1_ecdsa_anti_exfil_host_commit_cold_2();
  }
  else {
    if (rand32 != (uchar *)0x0) {
      local_78.s[0] = 0xfeefd675;
      local_78.s[1] = 0x73166c99;
      local_78.s[2] = 0xe2309cb8;
      local_78.s[3] = 0x6d458113;
      local_78.s[4] = 0x1d3a512;
      local_78.s[5] = 0xe18112;
      local_78.s[6] = 0x37ee0874;
      local_78.s[7] = 0x421fc55f;
      local_78.bytes = 0x40;
      secp256k1_sha256_write(&local_78,rand32,0x20);
      secp256k1_sha256_finalize(&local_78,rand_commitment32);
      return 1;
    }
    secp256k1_ecdsa_anti_exfil_host_commit_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_ecdsa_anti_exfil_host_commit(const secp256k1_context* ctx, unsigned char* rand_commitment32, const unsigned char* rand32) {
    secp256k1_sha256 sha;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(rand_commitment32 != NULL);
    ARG_CHECK(rand32 != NULL);

    secp256k1_s2c_ecdsa_data_sha256_tagged(&sha);
    secp256k1_sha256_write(&sha, rand32, 32);
    secp256k1_sha256_finalize(&sha, rand_commitment32);
    return 1;
}